

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multiply_test.cc
# Opt level: O1

void intgemm::TestMultiplyBias<intgemm::SSSE3::Kernels8>
               (Index A_rows,Index width,Index B_cols,float int_tolerance,float float_tolerance,
               float MSE_float_tolerance,float MSE_int_tolerance)

{
  UnquantizeAndAddBiasAndWrite callback;
  anon_class_16_2_a84000ed callback_00;
  float *pfVar1;
  float *float_ref;
  float *int_ref;
  size_t __i;
  ostream *poVar2;
  long lVar3;
  ulong uVar4;
  long lVar5;
  float fVar6;
  float unquant_mult;
  AlignedVector<float> B;
  AlignedVector<float> test_C;
  AlignedVector<float> bias;
  AlignedVector<float> A;
  AlignedVector<signed_char> A_prep;
  AlignedVector<float> float_C;
  AlignedVector<float> slowint_C;
  AlignedVector<signed_char> B_quant;
  AlignedVector<signed_char> B_prep;
  ostringstream info;
  mt19937 gen;
  AlignedVector<float> *pAVar7;
  undefined4 local_161c;
  AlignedVector<float> local_1618;
  AlignedVector<float> local_1608;
  AlignedVector<float> local_15f8;
  AlignedVector<float> local_15e8;
  float local_15d8;
  float local_15d4;
  float local_15d0;
  float local_15cc;
  AlignedVector<signed_char> local_15c8;
  AlignedVector<float> local_15b8;
  AlignedVector<float> local_15a8;
  AlignedVector<signed_char> local_1598;
  AlignedVector<signed_char> local_1588;
  undefined4 local_1578;
  undefined4 uStack_1574;
  float *pfStack_1570;
  AlignedVector<float> *local_1568;
  undefined4 *local_1560;
  AlignedVector<float> *pAStack_1558;
  string local_1550;
  ostringstream local_1530 [112];
  ios_base local_14c0 [264];
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  local_13b8;
  
  local_15d8 = int_tolerance;
  local_15d4 = float_tolerance;
  local_15d0 = MSE_float_tolerance;
  local_15cc = MSE_int_tolerance;
  std::__cxx11::ostringstream::ostringstream(local_1530);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1530,"8-bit SSSE3",0xb);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1530,"\t",1);
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)local_1530);
  local_13b8._M_x[0]._0_1_ = 9;
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>(poVar2,(char *)&local_13b8,1);
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  local_13b8._M_x[0]._0_1_ = 9;
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>(poVar2,(char *)&local_13b8,1);
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  local_13b8._M_x[0] = CONCAT71(local_13b8._M_x[0]._1_7_,10);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,(char *)&local_13b8,1);
  AlignedVector<float>::AlignedVector(&local_15e8,(ulong)(width * A_rows),0x40);
  AlignedVector<float>::AlignedVector(&local_1618,(ulong)(B_cols * width),0x40);
  AlignedVector<float>::AlignedVector(&local_15f8,(ulong)B_cols,0x40);
  pfVar1 = local_15e8.mem_;
  local_13b8._M_x[0] = 0x1571;
  lVar3 = 1;
  uVar4 = 0x1571;
  do {
    uVar4 = (ulong)(((uint)(uVar4 >> 0x1e) ^ (uint)uVar4) * 0x6c078965 + (int)lVar3);
    local_13b8._M_x[lVar3] = uVar4;
    lVar3 = lVar3 + 1;
  } while (lVar3 != 0x270);
  local_13b8._M_p = 0x270;
  if (local_15e8.size_ != 0) {
    lVar5 = local_15e8.size_ << 2;
    lVar3 = 0;
    do {
      fVar6 = std::
              generate_canonical<float,24ul,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
                        (&local_13b8);
      *(float *)((long)pfVar1 + lVar3) = fVar6 + fVar6 + -1.0;
      lVar3 = lVar3 + 4;
    } while (lVar5 != lVar3);
  }
  pfVar1 = local_1618.mem_;
  lVar3 = CONCAT44(local_1618.size_._4_4_,(Index)local_1618.size_);
  if (lVar3 != 0) {
    lVar5 = 0;
    do {
      fVar6 = std::
              generate_canonical<float,24ul,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
                        (&local_13b8);
      *(float *)((long)pfVar1 + lVar5) = fVar6 + fVar6 + -1.0;
      lVar5 = lVar5 + 4;
    } while (lVar3 << 2 != lVar5);
  }
  pfVar1 = local_15f8.mem_;
  if (local_15f8.size_ != 0) {
    lVar3 = 0;
    do {
      fVar6 = std::
              generate_canonical<float,24ul,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
                        (&local_13b8);
      *(float *)((long)pfVar1 + lVar3) = fVar6 + fVar6 + -1.0;
      lVar3 = lVar3 + 4;
    } while (local_15f8.size_ << 2 != lVar3);
  }
  local_161c = 0x39800000;
  AlignedVector<signed_char>::AlignedVector(&local_15c8,local_15e8.size_,0x40);
  AlignedVector<signed_char>::AlignedVector
            (&local_1588,CONCAT44(local_1618.size_._4_4_,(Index)local_1618.size_),0x40);
  SSSE3::Kernels8::PrepareA(local_15e8.mem_,local_15c8.mem_,64.0,A_rows,width);
  SSSE3::Kernels8::PrepareB(local_1618.mem_,local_1588.mem_,64.0,width,B_cols);
  AlignedVector<float>::AlignedVector(&local_1608,(ulong)(B_cols * A_rows),0x40);
  local_1578 = local_161c;
  pfStack_1570 = local_15f8.mem_;
  local_1568 = (AlignedVector<float> *)local_1608.mem_;
  callback._4_4_ = uStack_1574;
  callback.unquant_mult = (float)local_161c;
  callback.bias_addr = local_15f8.mem_;
  callback.output_addr = local_1608.mem_;
  pAVar7 = (AlignedVector<float> *)local_1608.mem_;
  SSSE3::Kernels8::Multiply<intgemm::callbacks::UnquantizeAndAddBiasAndWrite>
            (local_15c8.mem_,local_1588.mem_,A_rows,width,B_cols,callback);
  AlignedVector<signed_char>::AlignedVector
            (&local_1598,CONCAT44(local_1618.size_._4_4_,(Index)local_1618.size_),0x40);
  SSSE3::Kernels8::Quantize(local_1618.mem_,local_1598.mem_,64.0,(Index)local_1618.size_);
  AlignedVector<float>::AlignedVector(&local_15a8,local_1608.size_,0x40);
  local_1560 = &local_161c;
  pAStack_1558 = &local_15f8;
  callback_00.bias = pAVar7;
  callback_00.unquant_mult = (float *)pAStack_1558;
  references::
  Multiply<signed_char,_signed_char,_float,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_kpu[P]intgemm_test_multiply_test_cc:409:99),_nullptr>
            ((references *)local_15c8.mem_,local_1598.mem_,(char *)local_15a8.mem_,
             (float *)(ulong)A_rows,width,B_cols,(Index)local_1560,callback_00);
  AlignedVector<float>::AlignedVector(&local_15b8,local_1608.size_,0x40);
  references::
  Multiply<float,_float,_float,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_kpu[P]intgemm_test_multiply_test_cc:414:86),_nullptr>
            (local_15e8.mem_,local_1618.mem_,local_15b8.mem_,A_rows,width,B_cols,&local_15f8);
  int_ref = local_15a8.mem_;
  float_ref = local_15b8.mem_;
  pfVar1 = local_1608.mem_;
  std::__cxx11::stringbuf::str();
  CompareMSE(float_ref,int_ref,pfVar1,local_1608.size_,&local_1550,local_15d8,local_15d4,local_15d0,
             local_15cc);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1550._M_dataplus._M_p != &local_1550.field_2) {
    operator_delete(local_1550._M_dataplus._M_p);
  }
  free(local_15b8.mem_);
  free(local_15a8.mem_);
  free(local_1598.mem_);
  free(local_1608.mem_);
  free(local_1588.mem_);
  free(local_15c8.mem_);
  free(local_15f8.mem_);
  free(local_1618.mem_);
  free(local_15e8.mem_);
  std::__cxx11::ostringstream::~ostringstream(local_1530);
  std::ios_base::~ios_base(local_14c0);
  return;
}

Assistant:

void TestMultiplyBias(Index A_rows, Index width, Index B_cols,
 float int_tolerance = 0.1f, float float_tolerance = 1.0f, float MSE_float_tolerance = 0.0f, float MSE_int_tolerance = 0.0f) {
  using Integer = typename Routine::Integer;
  std::ostringstream info;
  info << Routine::kName << "\t" << A_rows << '\t' << width << '\t' << B_cols << '\n';

  // Initialize A and B.
  AlignedVector<float> A(A_rows * width);
  AlignedVector<float> B(width * B_cols);
  AlignedVector<float> bias(B_cols);
  std::mt19937 gen;
  std::uniform_real_distribution<float> dist(-1.0f, 1.0f);
  for (auto& it : A) {
    it = dist(gen);
  }
  for (auto& it : B) {
    it = dist(gen);
  }
  for (auto& it : bias) {
    it = dist(gen);
  }

  float quant_mult = (sizeof(Integer) == 2) ? 1024 : 64;
  float unquant_mult = 1.0f / (quant_mult*quant_mult);

  AlignedVector<Integer> A_prep(A.size());
  AlignedVector<Integer> B_prep(B.size());
  Routine::PrepareA(A.begin(), A_prep.begin(), quant_mult, A_rows, width);
  Routine::PrepareB(B.begin(), B_prep.begin(), quant_mult, width, B_cols);

  AlignedVector<float> test_C(A_rows * B_cols);

  Routine::Multiply(A_prep.begin(), B_prep.begin(), A_rows, width, B_cols, callbacks::UnquantizeAndAddBiasAndWrite(unquant_mult, bias.begin(), test_C.begin()));

  AlignedVector<Integer> B_quant(B.size());
  Routine::Quantize(B.begin(), B_quant.begin(), quant_mult, static_cast<Index>(B.size()));
  AlignedVector<float> slowint_C(test_C.size());
  // Assuming A is just quantization here.
  references::Multiply(A_prep.begin(), B_quant.begin(), slowint_C.begin(), A_rows, width, B_cols, [&](int32_t sum, const callbacks::OutputBufferInfo& info) {
    return sum * unquant_mult + bias[info.col_idx];
  });

  AlignedVector<float> float_C(test_C.size());
  references::Multiply(A.begin(), B.begin(), float_C.begin(), A_rows, width, B_cols, [&](double sum, const callbacks::OutputBufferInfo& info) {
    return static_cast<float>(sum) + bias[info.col_idx];
  });

  CompareMSE(float_C.begin(), slowint_C.begin(), test_C.begin(), test_C.size(), info.str(),
   int_tolerance, float_tolerance, MSE_float_tolerance, MSE_int_tolerance);
}